

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold)

{
  unsigned_long *__elements;
  tuple<long,_double,_double> *in_RDI;
  double *__elements_1;
  double *__elements_2;
  Meter meter;
  Meter *in_stack_ffffffffffffff30;
  tuple<long,_double,_double> *this_00;
  Meter *in_stack_ffffffffffffffa8;
  real in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb4;
  __node_base in_stack_ffffffffffffffb8;
  FastText *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  Meter::Meter(in_stack_ffffffffffffff30);
  test(in_stack_ffffffffffffffc0,(istream *)in_stack_ffffffffffffffb8._M_nxt,
       in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __elements = (unsigned_long *)Meter::nexamples((Meter *)&stack0xffffffffffffff88);
  __elements_1 = (double *)Meter::precision((Meter *)0x185996);
  __elements_2 = (double *)Meter::recall((Meter *)0x1859b4);
  std::tuple<long,_double,_double>::tuple<unsigned_long,_double,_double,_true,_true>
            (this_00,__elements,__elements_1,__elements_2);
  Meter::~Meter((Meter *)0x1859e9);
  return in_RDI;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter;
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}